

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_ARRAY::Load
          (_Type_ARRAY *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  long *plVar1;
  Array *this_00;
  Memory *pMVar2;
  _Alloc_hider idx;
  char cVar3;
  uint uVar4;
  uint uVar5;
  code *pcVar6;
  uint uVar7;
  long in_R8;
  string key;
  Nullable<LiteScript::Variable> local_50;
  
  Object::Reassign(object,(Type *)_type_array,0x38);
  Array::Array((Array *)object->data,object->memory);
  this_00 = (Array *)object->data;
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    pMVar2 = object->memory;
    plVar1 = (long *)((long)(pMVar2->arr)._M_elems + in_R8);
    pcVar6 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar6 = *(code **)(*plVar1 + -1 + caller);
    }
    uVar5 = (*pcVar6)(plVar1,stream);
    Memory::GetVariable((Nullable<LiteScript::Variable> *)&key,pMVar2,uVar5);
    Array::Add(this_00,uVar7,(Variable *)&key);
    Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)&key);
  }
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  uVar7 = 0;
  do {
    if (uVar7 == uVar4) {
      std::__cxx11::string::~string((string *)&key);
      return;
    }
    key._M_string_length = 0;
    *key._M_dataplus._M_p = '\0';
    while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
      cVar3 = std::istream::get();
      if (cVar3 == '\0') break;
      std::__cxx11::string::push_back((char)&key);
    }
    idx._M_p = key._M_dataplus._M_p;
    pMVar2 = object->memory;
    plVar1 = (long *)((long)(pMVar2->arr)._M_elems + in_R8);
    pcVar6 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar6 = *(code **)(*plVar1 + -1 + caller);
    }
    uVar5 = (*pcVar6)(plVar1,stream);
    Memory::GetVariable(&local_50,pMVar2,uVar5);
    Array::Add(this_00,idx._M_p,(Variable *)&local_50);
    Nullable<LiteScript::Variable>::Nullify(&local_50);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void LiteScript::_Type_ARRAY::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::ARRAY, sizeof(Array));
    std::allocator<Array> allocator;
    allocator.construct(&object.GetData<Array>(), object.memory);
    Array& obj = object.GetData<Array>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        obj.Add(i, *object.memory.GetVariable((object.memory.*caller)(stream)));
    sz = IStreamer::Read<unsigned int>(stream);
    std::string key;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
            key += c;
        obj.Add(key.c_str(), *object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}